

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satpos.cpp
# Opt level: O3

void __thiscall SatPos::CalculateEk(SatPos *this,double Mk,double ecc,double *Ek)

{
  int iVar1;
  double __x;
  double dVar2;
  double dVar3;
  
  iVar1 = 0xc;
  __x = 1.0;
  do {
    iVar1 = iVar1 + -1;
    if (iVar1 == 0) {
      return;
    }
    dVar2 = sin(__x);
    dVar2 = dVar2 * ecc + Mk;
    *Ek = dVar2;
    dVar3 = dVar2 - __x;
    __x = dVar2;
  } while (1e-07 <= ABS(dVar3));
  return;
}

Assistant:

void SatPos::CalculateEk(const double Mk, const double ecc, double &Ek)
{
    double Ek0 = 1;
    int count = 0;
    while (count <= 10)
    {
        Ek = Mk + ecc * sin(Ek0);
        double error = abs(Ek - Ek0);
        if(error < 1e-7)
            break;
        Ek0 = Ek;
        count ++;
    }
}